

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ValidPadding * __thiscall
CoreML::Specification::ConvolutionLayerParams::mutable_valid(ConvolutionLayerParams *this)

{
  ValidPadding *this_00;
  
  if (this->_oneof_case_[0] == 0x32) {
    this_00 = (this->ConvolutionPaddingType_).valid_;
  }
  else {
    clear_ConvolutionPaddingType(this);
    this->_oneof_case_[0] = 0x32;
    this_00 = (ValidPadding *)operator_new(0x20);
    ValidPadding::ValidPadding(this_00);
    (this->ConvolutionPaddingType_).valid_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::ValidPadding* ConvolutionLayerParams::mutable_valid() {
  if (!has_valid()) {
    clear_ConvolutionPaddingType();
    set_has_valid();
    ConvolutionPaddingType_.valid_ = new ::CoreML::Specification::ValidPadding;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ConvolutionLayerParams.valid)
  return ConvolutionPaddingType_.valid_;
}